

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O3

UINT8 __thiscall GYMPlayer::Stop(GYMPlayer *this)

{
  PLAYER_EVENT_CB p_Var1;
  pointer pGVar2;
  pointer pGVar3;
  ulong uVar4;
  long lVar5;
  
  this->_playState = this->_playState & 0xfe;
  pGVar3 = (this->_devices).
           super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->_devices).
           super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pGVar2 != pGVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      FreeDeviceTree((VGM_BASEDEV *)((long)(pGVar3->base).resmpl.smplBufs + lVar5 + -0x70),'\0');
      uVar4 = uVar4 + 1;
      pGVar3 = (this->_devices).
               super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pGVar2 = (this->_devices).
               super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0xa8;
    } while (uVar4 < (ulong)(((long)pGVar2 - (long)pGVar3 >> 3) * -0x30c30c30c30c30c3));
  }
  if (pGVar2 != pGVar3) {
    (this->_devices).
    super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar3;
  }
  p_Var1 = (this->super_PlayerBase)._eventCbFunc;
  if (p_Var1 != (PLAYER_EVENT_CB)0x0) {
    (*p_Var1)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x02',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 GYMPlayer::Stop(void)
{
	size_t curDev;
	
	_playState &= ~PLAYSTATE_PLAY;
	
	for (curDev = 0; curDev < _devices.size(); curDev ++)
	{
		GYM_CHIPDEV* cDev = &_devices[curDev];
		FreeDeviceTree(&cDev->base, 0);
	}
	_devices.clear();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_STOP, NULL);
	
	return 0x00;
}